

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

NondegeneracyCheckResult * __thiscall
slang::ast::BinaryAssertionExpr::checkNondegeneracyImpl(BinaryAssertionExpr *this)

{
  BinaryAssertionExpr **ppBVar1;
  NondegeneracyCheckResult **ppNVar2;
  bool bVar3;
  SequenceRange *pSVar4;
  long in_RSI;
  NondegeneracyCheckResult *in_RDI;
  NondegeneracyCheckResult *res;
  optional<slang::ast::SequenceRange> rightLen_1;
  optional<slang::ast::SequenceRange> leftLen_1;
  optional<slang::ast::SequenceRange> rightLen;
  optional<slang::ast::SequenceRange> leftLen;
  anon_class_48_6_03f1c37d joinNoMatchReasons;
  bool rightAdmitsNoMatch;
  bool leftAdmitsNoMatch;
  bool rightAdmitsEmpty;
  bool leftAdmitsEmpty;
  bitmask<slang::ast::NondegeneracyStatus> rightNondegenSt;
  bitmask<slang::ast::NondegeneracyStatus> leftNondegenSt;
  NondegeneracyCheckResult rightNondegen;
  NondegeneracyCheckResult leftNondegen;
  bitmask<slang::ast::NondegeneracyStatus> *in_stack_fffffffffffffe78;
  NondegeneracyCheckResult *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe98;
  NondegeneracyStatus value;
  anon_class_48_6_03f1c37d *this_00;
  bitmask<slang::ast::NondegeneracyStatus> local_108;
  bitmask<slang::ast::NondegeneracyStatus> local_104;
  bitmask<slang::ast::NondegeneracyStatus> local_100;
  _Optional_payload_base<slang::ast::SequenceRange> local_fc;
  _Optional_payload_base<slang::ast::SequenceRange> local_ec;
  bitmask<slang::ast::NondegeneracyStatus> local_dc;
  bitmask<slang::ast::NondegeneracyStatus> local_d8;
  _Optional_payload_base<slang::ast::SequenceRange> local_d4;
  _Optional_payload_base<slang::ast::SequenceRange> local_c4;
  bitmask<slang::ast::NondegeneracyStatus> local_b4;
  bitmask<slang::ast::NondegeneracyStatus> local_b0;
  bitmask<slang::ast::NondegeneracyStatus> local_ac;
  bitmask<slang::ast::NondegeneracyStatus> local_a8;
  bitmask<slang::ast::NondegeneracyStatus> local_a4;
  byte *local_a0;
  BinaryAssertionExpr **local_90;
  byte *local_88;
  NondegeneracyCheckResult **local_80;
  bitmask<slang::ast::NondegeneracyStatus> local_70;
  byte local_69;
  bitmask<slang::ast::NondegeneracyStatus> local_68;
  byte local_61;
  undefined1 local_60 [15];
  byte local_51;
  anon_class_48_6_03f1c37d local_50;
  
  ppBVar1 = &local_50.this;
  AssertionExpr::checkNondegeneracy((AssertionExpr *)in_stack_fffffffffffffe80);
  ppNVar2 = &local_50.res;
  AssertionExpr::checkNondegeneracy((AssertionExpr *)in_stack_fffffffffffffe80);
  local_50.leftAdmitsNoMatch._4_4_ = local_50.this._0_4_;
  local_50.leftAdmitsNoMatch._0_4_ = local_50.res._0_4_;
  value = AdmitsEmpty;
  bitmask<slang::ast::NondegeneracyStatus>::bitmask
            ((bitmask<slang::ast::NondegeneracyStatus> *)(local_60 + 8),AdmitsEmpty);
  local_51 = bitmask<slang::ast::NondegeneracyStatus>::has
                       (&in_stack_fffffffffffffe80->status,in_stack_fffffffffffffe78);
  pSVar4 = (SequenceRange *)local_60;
  bitmask<slang::ast::NondegeneracyStatus>::bitmask
            ((bitmask<slang::ast::NondegeneracyStatus> *)pSVar4,value);
  this_00 = &local_50;
  local_60[7] = bitmask<slang::ast::NondegeneracyStatus>::has
                          (&in_stack_fffffffffffffe80->status,in_stack_fffffffffffffe78);
  bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_68,AdmitsNoMatch);
  local_61 = bitmask<slang::ast::NondegeneracyStatus>::has
                       (&in_stack_fffffffffffffe80->status,in_stack_fffffffffffffe78);
  bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_70,AdmitsNoMatch);
  local_69 = bitmask<slang::ast::NondegeneracyStatus>::has
                       (&in_stack_fffffffffffffe80->status,in_stack_fffffffffffffe78);
  AssertionExpr::NondegeneracyCheckResult::NondegeneracyCheckResult(in_stack_fffffffffffffe80);
  local_a0 = &local_61;
  local_88 = &local_69;
  local_90 = ppBVar1;
  local_80 = ppNVar2;
  switch(*(undefined4 *)(in_RSI + 0x10)) {
  case 0:
    if (((local_51 & 1) != 0) && ((local_60[7] & 1) != 0)) {
      bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_ac,AdmitsEmpty);
      bitmask<slang::ast::NondegeneracyStatus>::operator|=(&in_RDI->status,&local_ac);
    }
    if (((local_61 & 1) != 0) || ((local_69 & 1) != 0)) {
      bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_b0,AdmitsNoMatch);
      bitmask<slang::ast::NondegeneracyStatus>::operator|=(&in_RDI->status,&local_b0);
      checkNondegeneracyImpl::anon_class_48_6_03f1c37d::operator()(this_00);
    }
    break;
  case 1:
    if (((local_51 & 1) != 0) || ((local_60[7] & 1) != 0)) {
      bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_a4,AdmitsEmpty);
      bitmask<slang::ast::NondegeneracyStatus>::operator|=(&in_RDI->status,&local_a4);
    }
    if (((local_61 & 1) != 0) && ((local_69 & 1) != 0)) {
      bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_a8,AdmitsNoMatch);
      bitmask<slang::ast::NondegeneracyStatus>::operator|=(&in_RDI->status,&local_a8);
      checkNondegeneracyImpl::anon_class_48_6_03f1c37d::operator()(this_00);
    }
    break;
  case 2:
    if (((local_51 & 1) != 0) && ((local_60[7] & 1) != 0)) {
      bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_b4,AdmitsEmpty);
      bitmask<slang::ast::NondegeneracyStatus>::operator|=(&in_RDI->status,&local_b4);
    }
    local_c4 = (_Optional_payload_base<slang::ast::SequenceRange>)
               AssertionExpr::computeSequenceLength((AssertionExpr *)in_stack_fffffffffffffe80);
    local_d4 = (_Optional_payload_base<slang::ast::SequenceRange>)
               AssertionExpr::computeSequenceLength((AssertionExpr *)in_stack_fffffffffffffe80);
    if (((local_61 & 1) == 0) && ((local_69 & 1) == 0)) {
      bVar3 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRange> *)0x9d326e);
      if (!bVar3) {
        return in_RDI;
      }
      bVar3 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRange> *)0x9d3281);
      if (!bVar3) {
        return in_RDI;
      }
      std::optional<slang::ast::SequenceRange>::operator->
                ((optional<slang::ast::SequenceRange> *)0x9d3294);
      std::optional<slang::ast::SequenceRange>::operator*
                ((optional<slang::ast::SequenceRange> *)0x9d32a6);
      bVar3 = SequenceRange::canIntersect
                        (pSVar4,(SequenceRange *)CONCAT44(value,in_stack_fffffffffffffe98));
      if (bVar3) {
        return in_RDI;
      }
    }
    bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_d8,AdmitsNoMatch);
    bitmask<slang::ast::NondegeneracyStatus>::operator|=(&in_RDI->status,&local_d8);
    checkNondegeneracyImpl::anon_class_48_6_03f1c37d::operator()(this_00);
    break;
  case 3:
    if ((local_60[7] & 1) != 0) {
      bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_104,AdmitsEmpty);
      bitmask<slang::ast::NondegeneracyStatus>::operator|=(&in_RDI->status,&local_104);
    }
    if ((local_69 & 1) != 0) {
      bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_108,AdmitsNoMatch);
      bitmask<slang::ast::NondegeneracyStatus>::operator|=(&in_RDI->status,&local_108);
      (in_RDI->noMatchRange).startLoc = (SourceLocation)local_50.leftNondegen;
      (in_RDI->noMatchRange).endLoc = (SourceLocation)local_50.rightAdmitsNoMatch;
      in_RDI->isAlwaysFalse = (bool)((byte)local_50.rightNondegen & 1);
    }
    break;
  case 4:
    if (((local_51 & 1) != 0) && ((local_60[7] & 1) != 0)) {
      bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_dc,AdmitsEmpty);
      bitmask<slang::ast::NondegeneracyStatus>::operator|=(&in_RDI->status,&local_dc);
    }
    local_ec = (_Optional_payload_base<slang::ast::SequenceRange>)
               AssertionExpr::computeSequenceLength((AssertionExpr *)in_stack_fffffffffffffe80);
    local_fc = (_Optional_payload_base<slang::ast::SequenceRange>)
               AssertionExpr::computeSequenceLength((AssertionExpr *)in_stack_fffffffffffffe80);
    if (((local_61 & 1) == 0) && ((local_69 & 1) == 0)) {
      bVar3 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRange> *)0x9d3385);
      if (!bVar3) {
        return in_RDI;
      }
      bVar3 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRange> *)0x9d3398);
      if (!bVar3) {
        return in_RDI;
      }
      pSVar4 = std::optional<slang::ast::SequenceRange>::operator->
                         ((optional<slang::ast::SequenceRange> *)0x9d33ab);
      std::optional<slang::ast::SequenceRange>::operator*
                ((optional<slang::ast::SequenceRange> *)0x9d33bc);
      bVar3 = SequenceRange::canBeWithin((SequenceRange *)in_stack_fffffffffffffe80,pSVar4);
      if (bVar3) {
        return in_RDI;
      }
    }
    bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_100,AdmitsNoMatch);
    bitmask<slang::ast::NondegeneracyStatus>::operator|=(&in_RDI->status,&local_100);
    checkNondegeneracyImpl::anon_class_48_6_03f1c37d::operator()(this_00);
  }
  return in_RDI;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult BinaryAssertionExpr::checkNondegeneracyImpl() const {
    const auto leftNondegen = left.checkNondegeneracy();
    const auto rightNondegen = right.checkNondegeneracy();
    const auto leftNondegenSt = leftNondegen.status;
    const auto rightNondegenSt = rightNondegen.status;
    const bool leftAdmitsEmpty = leftNondegenSt.has(NondegeneracyStatus::AdmitsEmpty);
    const bool rightAdmitsEmpty = rightNondegenSt.has(NondegeneracyStatus::AdmitsEmpty);
    const bool leftAdmitsNoMatch = leftNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch);
    const bool rightAdmitsNoMatch = rightNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch);

    NondegeneracyCheckResult res;
    auto joinNoMatchReasons = [&] {
        if (leftAdmitsNoMatch) {
            res.noMatchRange = leftNondegen.noMatchRange;
            res.isAlwaysFalse = leftNondegen.isAlwaysFalse;
        }
        else if (rightAdmitsNoMatch) {
            res.noMatchRange = rightNondegen.noMatchRange;
            res.isAlwaysFalse = rightNondegen.isAlwaysFalse;
        }
        else if (left.syntax && right.syntax) {
            res.noMatchRange = {left.syntax->getFirstToken().location(),
                                right.syntax->sourceRange().end()};
            res.isAlwaysFalse = false;
        }
    };

    switch (op) {
        case BinaryAssertionOperator::Or: {
            if (leftAdmitsEmpty || rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `or` full sequence is no match if and only if both parts are no match.
            if (leftAdmitsNoMatch && rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::And: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `and` full sequence is no match if and only if any part is no match.
            if (leftAdmitsNoMatch || rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Intersect: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `intersect` full sequence is no match if both parts don't have any
            // possible overlap in their length ranges.
            const auto leftLen = left.computeSequenceLength();
            const auto rightLen = right.computeSequenceLength();
            if (leftAdmitsNoMatch || rightAdmitsNoMatch ||
                (leftLen && rightLen && !leftLen->canIntersect(*rightLen))) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Within: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `within` full sequence is no match if left side delay range is within
            // right side delay range.
            const auto leftLen = left.computeSequenceLength();
            const auto rightLen = right.computeSequenceLength();
            if (leftAdmitsNoMatch || rightAdmitsNoMatch ||
                (leftLen && rightLen && !leftLen->canBeWithin(*rightLen))) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Throughout: {
            if (rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `throughout` full sequence is no match if right part is no match
            if (rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                res.noMatchRange = rightNondegen.noMatchRange;
                res.isAlwaysFalse = rightNondegen.isAlwaysFalse;
            }
            break;
        }
        default:
            break;
    }

    return res;
}